

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

int run_test_ipc_listen_after_write(void)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  
  iVar1 = run_ipc_test("ipc_helper_listen_after_write",on_read);
  if ((long)local_conn_accepted != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x1c2,"1","==","local_conn_accepted",1,"==",(long)local_conn_accepted);
    abort();
  }
  if ((long)remote_conn_accepted != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x1c3,"1","==","remote_conn_accepted",1,"==",(long)remote_conn_accepted);
    abort();
  }
  if ((long)read_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x1c4,"1","==","read_cb_called",1,"==",(long)read_cb_called);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x1c5,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  return iVar1;
}

Assistant:

TEST_IMPL(ipc_listen_after_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_after_write", on_read);
  ASSERT_EQ(1, local_conn_accepted);
  ASSERT_EQ(1, remote_conn_accepted);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  return r;
}